

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O0

LY_ERR schema_mount_sprinter_tree_node_override_parent_refs
                 (lysc_node *node,void *plugin_priv,ly_bool *skip,char **UNUSED_flags,
                 char **add_opts)

{
  long lVar1;
  lysc_module *plVar2;
  bool bVar3;
  lysc_node *local_58;
  lysc_node *iter;
  lysc_node *ref;
  lysc_module *mod;
  ly_set *refs;
  uint32_t i;
  char **add_opts_local;
  char **UNUSED_flags_local;
  ly_bool *skip_local;
  void *plugin_priv_local;
  lysc_node *node_local;
  
  lVar1 = *(long *)((long)plugin_priv + 8);
  plVar2 = node->module->compiled;
  *skip = '\x01';
  refs._4_4_ = 0;
  do {
    bVar3 = false;
    if (refs._4_4_ < *(uint *)(lVar1 + 4)) {
      bVar3 = *skip != '\0';
    }
    if (!bVar3) {
      if ((*skip == '\0') && (node->parent == (lysc_node *)0x0)) {
        *add_opts = "@";
      }
      return LY_SUCCESS;
    }
    local_58 = *(lysc_node **)(*(long *)(lVar1 + 8) + (ulong)refs._4_4_ * 8);
    if (local_58->module->compiled == plVar2) {
      for (; local_58 != (lysc_node *)0x0; local_58 = local_58->parent) {
        if (local_58 == node) {
          *skip = '\0';
          break;
        }
      }
    }
    refs._4_4_ = refs._4_4_ + 1;
  } while( true );
}

Assistant:

static LY_ERR
schema_mount_sprinter_tree_node_override_parent_refs(const struct lysc_node *node, const void *plugin_priv,
        ly_bool *skip, const char **UNUSED(flags), const char **add_opts)
{
    uint32_t i;
    const struct ly_set *refs;
    const struct lysc_module *mod;
    struct lysc_node *ref, *iter;

    refs = ((struct sprinter_tree_priv *)plugin_priv)->refs;
    mod = node->module->compiled;

    /* Assume the @p node will be skipped. */
    *skip = 1;
    for (i = 0; (i < refs->count) && *skip; i++) {
        ref = refs->snodes[i];
        if (ref->module->compiled != mod) {
            /* parent-reference points to different module */
            continue;
        }

        for (iter = ref; iter; iter = iter->parent) {
            if (iter == node) {
                /* @p node is not skipped because it is parent-rererence node or his parent */
                *skip = 0;
                break;
            }
        }
    }

    if (!*skip && !node->parent) {
        /* top-node has additional opts */
        *add_opts = "@";
    }

    return LY_SUCCESS;
}